

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

ExprTree * __thiscall
PcodeCompile::createOp(PcodeCompile *this,OpCode opc,ExprTree *vn1,ExprTree *vn2)

{
  vector<OpTpl*,std::allocator<OpTpl*>> *this_00;
  VarnodeTpl *pVVar1;
  OpTpl *this_01;
  VarnodeTpl *this_02;
  OpTpl *local_60;
  OpTpl *op;
  OpTpl **local_50;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_48;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_40;
  const_iterator local_38;
  VarnodeTpl *local_30;
  VarnodeTpl *outvn;
  ExprTree *vn2_local;
  ExprTree *vn1_local;
  PcodeCompile *pPStack_10;
  OpCode opc_local;
  PcodeCompile *this_local;
  
  outvn = (VarnodeTpl *)vn2;
  vn2_local = vn1;
  vn1_local._4_4_ = opc;
  pPStack_10 = this;
  local_30 = buildTemporary(this);
  this_00 = (vector<OpTpl*,std::allocator<OpTpl*>> *)vn2_local->ops;
  local_40._M_current =
       (OpTpl **)
       std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end
                 ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)this_00);
  __gnu_cxx::__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>>::
  __normal_iterator<OpTpl**>
            ((__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>> *)&local_38
             ,&local_40);
  local_48._M_current =
       (OpTpl **)
       std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin
                 (*(vector<OpTpl_*,_std::allocator<OpTpl_*>_> **)&outvn->space);
  local_50 = (OpTpl **)
             std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end
                       (*(vector<OpTpl_*,_std::allocator<OpTpl_*>_> **)&outvn->space);
  op = (OpTpl *)std::vector<OpTpl*,std::allocator<OpTpl*>>::
                insert<__gnu_cxx::__normal_iterator<OpTpl**,std::vector<OpTpl*,std::allocator<OpTpl*>>>,void>
                          (this_00,local_38,local_48,
                           (__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                            )local_50);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::clear
            (*(vector<OpTpl_*,_std::allocator<OpTpl_*>_> **)&outvn->space);
  this_01 = (OpTpl *)operator_new(0x28);
  OpTpl::OpTpl(this_01,vn1_local._4_4_);
  local_60 = this_01;
  OpTpl::addInput(this_01,vn2_local->outvn);
  OpTpl::addInput(local_60,(VarnodeTpl *)(outvn->space).value.spaceid);
  (outvn->space).value.spaceid = (AddrSpace *)0x0;
  OpTpl::setOutput(local_60,local_30);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back(vn2_local->ops,&local_60);
  this_02 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_02,local_30);
  pVVar1 = outvn;
  vn2_local->outvn = this_02;
  if (outvn != (VarnodeTpl *)0x0) {
    ExprTree::~ExprTree((ExprTree *)outvn);
    operator_delete(pVVar1);
  }
  return vn2_local;
}

Assistant:

ExprTree *PcodeCompile::createOp(OpCode opc,ExprTree *vn1,
				    ExprTree *vn2)

{				// Create new expression with output -outvn-
				// built by performing -opc- on inputs vn1 and vn2.
				// Free input expressions
  VarnodeTpl *outvn = buildTemporary();
  vn1->ops->insert(vn1->ops->end(),vn2->ops->begin(),vn2->ops->end());
  vn2->ops->clear();
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn1->outvn);
  op->addInput(vn2->outvn);
  vn2->outvn = (VarnodeTpl *)0;
  op->setOutput(outvn);
  vn1->ops->push_back(op);
  vn1->outvn = new VarnodeTpl(*outvn);
  delete vn2;
  return vn1;
}